

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_target_env.cpp
# Opt level: O0

bool __thiscall
spvParseTargetEnv::anon_class_8_1_54a39813::operator()(anon_class_8_1_54a39813 *this,char *b)

{
  char *__s1;
  int iVar1;
  size_t __n;
  bool local_19;
  char *b_local;
  anon_class_8_1_54a39813 *this_local;
  
  local_19 = false;
  if (this->s != (char *)0x0) {
    __s1 = this->s;
    __n = strlen(b);
    iVar1 = strncmp(__s1,b,__n);
    local_19 = iVar1 == 0;
  }
  return local_19;
}

Assistant:

bool spvParseTargetEnv(const char* s, spv_target_env* env) {
  auto match = [s](const char* b) {
    return s && (0 == strncmp(s, b, strlen(b)));
  };
  for (auto& name_env : spvTargetEnvNameMap) {
    if (match(name_env.first)) {
      if (env) {
        *env = name_env.second;
      }
      return true;
    }
  }
  if (env) *env = SPV_ENV_UNIVERSAL_1_0;
  return false;
}